

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

Op __thiscall spirv_cross::CompilerGLSL::get_remapped_spirv_op(CompilerGLSL *this,Op op)

{
  Op local_14;
  Op op_local;
  CompilerGLSL *this_local;
  
  local_14 = op;
  if (((this->options).relax_nan_checks & 1U) != 0) {
    switch(op) {
    case OpFUnordEqual:
      local_14 = OpFOrdEqual;
      break;
    case OpFOrdNotEqual:
      local_14 = OpFUnordNotEqual;
      break;
    default:
      break;
    case OpFUnordLessThan:
      local_14 = OpFOrdLessThan;
      break;
    case OpFUnordGreaterThan:
      local_14 = OpFOrdGreaterThan;
      break;
    case OpFUnordLessThanEqual:
      local_14 = OpFOrdLessThanEqual;
      break;
    case OpFUnordGreaterThanEqual:
      local_14 = OpFOrdGreaterThanEqual;
    }
  }
  return local_14;
}

Assistant:

Op CompilerGLSL::get_remapped_spirv_op(Op op) const
{
	if (options.relax_nan_checks)
	{
		switch (op)
		{
		case OpFUnordLessThan:
			op = OpFOrdLessThan;
			break;
		case OpFUnordLessThanEqual:
			op = OpFOrdLessThanEqual;
			break;
		case OpFUnordGreaterThan:
			op = OpFOrdGreaterThan;
			break;
		case OpFUnordGreaterThanEqual:
			op = OpFOrdGreaterThanEqual;
			break;
		case OpFUnordEqual:
			op = OpFOrdEqual;
			break;
		case OpFOrdNotEqual:
			op = OpFUnordNotEqual;
			break;

		default:
			break;
		}
	}

	return op;
}